

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O0

void __thiscall
directed_flag_complex_t::do_for_each_cell<directed_flag_complex_computer::reorder_edges_t>
          (directed_flag_complex_t *this,reorder_edges_t *f,int min_dimension,int max_dimension,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *possible_next_vertices,
          vertex_index_t *prefix,unsigned_short prefix_size)

{
  unsigned_short uVar1;
  ulong uVar2;
  bool bVar3;
  reference puVar4;
  int in_ECX;
  int in_EDX;
  directed_flag_complex_t *in_RSI;
  value_type_conflict1 *in_RDI;
  vertex_index_t *in_R8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_R9;
  unsigned_short unaff_retaddr;
  ushort in_stack_00000008;
  int b;
  size_t vertex_offset;
  size_t bits;
  size_t offset;
  unsigned_short v;
  const_iterator __end4;
  const_iterator __begin4;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range4;
  vector<unsigned_short,_std::allocator<unsigned_short>_> new_possible_vertices;
  unsigned_short vertex;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range2;
  uint in_stack_ffffffffffffff38;
  vertex_index_t in_stack_ffffffffffffff3c;
  vertex_index_t in_stack_ffffffffffffff3e;
  directed_graph_t *in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff50;
  short in_stack_ffffffffffffff52;
  int in_stack_ffffffffffffff54;
  ulong local_a0;
  ulong local_98;
  int in_stack_ffffffffffffff84;
  vertex_index_t *in_stack_ffffffffffffff88;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  in_stack_ffffffffffffff90;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_38;
  vertex_index_t *pvVar5;
  
  if (in_EDX + 1 <= (int)(uint)in_stack_00000008) {
    directed_flag_complex_computer::reorder_edges_t::operator()
              ((reorder_edges_t *)in_stack_ffffffffffffff90._M_current,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff84);
  }
  if ((uint)in_stack_00000008 != in_ECX + 1U) {
    pvVar5 = in_R8;
    local_38._M_current =
         (unsigned_short *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    CONCAT26(in_stack_ffffffffffffff3e,
                             CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)));
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               CONCAT26(in_stack_ffffffffffffff3e,
                        CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)));
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                               *)in_stack_ffffffffffffff40,
                              (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                               *)CONCAT26(in_stack_ffffffffffffff3e,
                                          CONCAT24(in_stack_ffffffffffffff3c,
                                                   in_stack_ffffffffffffff38))), bVar3) {
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&local_38);
      uVar1 = *puVar4;
      *(unsigned_short *)
       ((long)&(in_R9->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_start + (ulong)in_stack_00000008 * 2) = uVar1;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1d786e);
      if (in_stack_00000008 == 0) {
        for (local_98 = 0; local_98 < *(ulong *)(*(long *)in_RDI + 0xa0); local_98 = local_98 + 1) {
          local_a0 = directed_graph_t::get_outgoing_chunk
                               (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3e,0x1d798e);
          while (local_a0 != 0) {
            in_stack_ffffffffffffff54 = 0;
            for (uVar2 = local_a0; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
              in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 + 1;
            }
            local_a0 = local_a0 & ~(1L << ((ulong)(byte)in_stack_ffffffffffffff54 & 0x3f));
            in_stack_ffffffffffffff52 = (short)(local_98 << 6) + (short)in_stack_ffffffffffffff54;
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       in_stack_ffffffffffffff40,
                       (value_type_conflict1 *)
                       CONCAT26(in_stack_ffffffffffffff3e,
                                CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)));
          }
        }
      }
      else {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   CONCAT26(in_stack_ffffffffffffff3e,
                            CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)));
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   CONCAT26(in_stack_ffffffffffffff3e,
                            CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)));
        while (bVar3 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                   *)in_stack_ffffffffffffff40,
                                  (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                   *)CONCAT26(in_stack_ffffffffffffff3e,
                                              CONCAT24(in_stack_ffffffffffffff3c,
                                                       in_stack_ffffffffffffff38))), bVar3) {
          puVar4 = __gnu_cxx::
                   __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                   ::operator*((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                *)&stack0xffffffffffffff90);
          if ((uVar1 != *puVar4) &&
             (bVar3 = directed_graph_t::is_connected_by_an_edge
                                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3e,
                                 in_stack_ffffffffffffff3c), bVar3)) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       CONCAT44(in_stack_ffffffffffffff54,
                                CONCAT22(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50)),
                       in_RDI);
          }
          __gnu_cxx::
          __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
          ::operator++((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        *)&stack0xffffffffffffff90);
        }
      }
      in_stack_ffffffffffffff38 = (uint)(ushort)(in_stack_00000008 + 1);
      do_for_each_cell<directed_flag_complex_computer::reorder_edges_t>
                (in_RSI,(reorder_edges_t *)CONCAT44(in_EDX,in_ECX),(int)((ulong)pvVar5 >> 0x20),
                 (int)pvVar5,in_R9,in_R8,unaff_retaddr);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,
                          CONCAT22(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50)));
      __gnu_cxx::
      __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator++(&local_38);
    }
  }
  return;
}

Assistant:

void do_for_each_cell(Func& f, int min_dimension, int max_dimension,
	                      const std::vector<vertex_index_t>& possible_next_vertices, vertex_index_t* prefix,
	                      unsigned short prefix_size = 0) {
		// As soon as we have the correct dimension, execute f
		if (prefix_size >= min_dimension + 1) { f(prefix, prefix_size); }

		// If this is the last dimension we are interested in, exit this branch
		if (prefix_size == max_dimension + 1) return;

		for (auto vertex : possible_next_vertices) {
			// We can write the cell given by taking the current vertex as the maximal element
			prefix[prefix_size] = vertex;

			// And compute the next elements
			std::vector<vertex_index_t> new_possible_vertices;
			if (prefix_size > 0) {
				for (auto v : possible_next_vertices) {
					if (vertex != v && graph.is_connected_by_an_edge(vertex, v)) new_possible_vertices.push_back(v);
				}
			} else {
				// Get outgoing vertices of v in chunks of 64
				for (size_t offset = 0; offset < graph.incidence_row_length; offset++) {
					size_t bits = graph.get_outgoing_chunk(vertex, offset);

					size_t vertex_offset = offset << 6;
					while (bits > 0) {
						// Get the least significant non-zero bit
						auto b = __builtin_ctzl(bits);

						// Unset this bit
						bits &= ~(ONE_ << b);

						new_possible_vertices.push_back(vertex_index_t(vertex_offset + b));
					}
				}
			}

			do_for_each_cell(f, min_dimension, max_dimension, new_possible_vertices, prefix, prefix_size + 1);
		}
	}